

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * multiSelectCollSeq(Parse *pParse,Select *p,int iCol)

{
  CollSeq *pCVar1;
  
  if ((p->pPrior != (Select *)0x0) &&
     (pCVar1 = multiSelectCollSeq(pParse,p->pPrior,iCol), pCVar1 != (CollSeq *)0x0)) {
    return pCVar1;
  }
  if (p->pEList->nExpr <= iCol) {
    return (CollSeq *)0x0;
  }
  pCVar1 = sqlite3ExprCollSeq(pParse,p->pEList->a[iCol].pExpr);
  return pCVar1;
}

Assistant:

static CollSeq *multiSelectCollSeq(Parse *pParse, Select *p, int iCol){
  CollSeq *pRet;
  if( p->pPrior ){
    pRet = multiSelectCollSeq(pParse, p->pPrior, iCol);
  }else{
    pRet = 0;
  }
  assert( iCol>=0 );
  if( pRet==0 && iCol<p->pEList->nExpr ){
    pRet = sqlite3ExprCollSeq(pParse, p->pEList->a[iCol].pExpr);
  }
  return pRet;
}